

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

uint32_t spvtools::val::anon_unknown_0::GetVUIDForBuiltin(BuiltIn builtIn,VUIDError type)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x270) {
      return 0;
    }
    lVar1 = lVar2 + 0x10;
  } while (*(BuiltIn *)((long)&(anonymous_namespace)::builtinVUIDInfo + lVar2) != builtIn);
  return *(uint32_t *)(&UNK_002f8e88 + lVar2 + (ulong)type * 4);
}

Assistant:

uint32_t GetVUIDForBuiltin(spv::BuiltIn builtIn, VUIDError type) {
  uint32_t vuid = 0;
  for (const auto& iter: builtinVUIDInfo) {
    if (iter.builtIn == builtIn) {
      assert(type < VUIDErrorMax);
      vuid = iter.vuid[type];
      break;
    }
  }
  return vuid;
}